

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicAtomicCase1::Run(BasicAtomicCase1 *this)

{
  bool bVar1;
  GLuint GVar2;
  uint local_17c;
  uint local_178;
  GLint i_2;
  GLint data_3 [4];
  uint local_15c;
  uint local_158;
  GLuint i_1;
  GLuint data_2 [4];
  int local_13c;
  undefined8 uStack_138;
  int ii;
  float data_1 [8];
  int data [4];
  GLuint i;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *glsl_fs;
  char *glsl_gs;
  char *glsl_vs;
  BasicAtomicCase1_conflict *this_local;
  
  glsl_vs = (char *)this;
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS((ShaderStorageBufferObjectBase *)this,2);
  if (bVar1) {
    bVar1 = ShaderStorageBufferObjectBase::SupportedInGS((ShaderStorageBufferObjectBase *)this,2);
    if (bVar1) {
      glsl_gs = 
      "\nlayout(location = 0) in vec4 g_in_position;\nlayout(std430, binding = 0) coherent buffer VSuint {\n  uint g_uint_out[4];\n};\nlayout(std430, binding = 1) coherent buffer VSint {\n  int data[4];\n} g_int_out;\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  gl_Position = g_in_position;\n\n  if (atomicExchange(g_uint_out[gl_VertexID], g_uint_value[1]) != 0u) return;\n  if (atomicAdd(g_uint_out[gl_VertexID], g_uint_value[2]) != 1u) return;\n  if (atomicMin(g_uint_out[gl_VertexID], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_out[gl_VertexID], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_out[gl_VertexID], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_out[gl_VertexID], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_out[gl_VertexID], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_out[gl_VertexID], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_out[gl_VertexID] = 1u;\n    return;\n  }\n\n  if (atomicExchange(g_int_out.data[gl_VertexID], 1) != 0) return;\n  if (atomicAdd(g_int_out.data[gl_VertexID], 2) != 1) return;\n  if (atomicMin(g_int_out.data[gl_VertexID], 1) != 3) return;\n  if (atomicMax(g_int_out.data[gl_VertexID], 2) != 1) return;\n  if (atomicAnd(g_int_out.data[gl_VertexID], 0x1) != 2) return;\n  if (atomicOr(g_int_out.data[gl_VertexID], 0x3) != 0) return;\n  if (atomicXor(g_int_out.data[gl_VertexID], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_out.data[gl_VertexID], 0x2, 0x7) != 2) {\n    g_int_out.data[gl_VertexID] = 1;\n    return;\n  }\n}"
      ;
      glsl_fs = 
      "\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout(std430, binding = 2) coherent buffer GSuint {\n  uint data[4];\n} g_uint_gs;\nlayout(std430, binding = 3) coherent buffer GSint {\n  int data[4];\n} g_int_gs;\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  gl_Position = gl_in[0].gl_Position;\n  gl_PrimitiveID = gl_PrimitiveIDIn;\n  EmitVertex();\n\n  if (atomicExchange(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[1]) != 0u) return;\n  if (atomicAdd(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[2]) != 1u) return;\n  if (atomicMin(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_gs.data[gl_PrimitiveIDIn] = 1u;\n    return;\n  }\n\n  if (atomicExchange(g_int_gs.data[gl_PrimitiveIDIn], 1) != 0) return;\n  if (atomicAdd(g_int_gs.data[gl_PrimitiveIDIn], 2) != 1) return;\n  if (atomicMin(g_int_gs.data[gl_PrimitiveIDIn], 1) != 3) return;\n  if (atomicMax(g_int_gs.data[gl_PrimitiveIDIn], 2) != 1) return;\n  if (atomicAnd(g_int_gs.data[gl_PrimitiveIDIn], 0x1) != 2) return;\n  if (atomicOr(g_int_gs.data[gl_PrimitiveIDIn], 0x3) != 0) return;\n  if (atomicXor(g_int_gs.data[gl_PrimitiveIDIn], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_gs.data[gl_PrimitiveIDIn], 0x2, 0x7) != 2) {\n    g_int_gs.data[gl_PrimitiveIDIn] = 1;\n    return;\n  }\n}"
      ;
      local_30 = 
      "\nlayout(location = 0) out vec4 g_fs_out;\nlayout(std430, binding = 4) coherent buffer FSuint {\n  uint data[4];\n} g_uint_fs;\nlayout(std430, binding = 5) coherent buffer FSint {\n  int data[4];\n} g_int_fs;\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n\n  if (atomicExchange(g_uint_fs.data[gl_PrimitiveID], g_uint_value[1]) != 0u) return;\n  if (atomicAdd(g_uint_fs.data[gl_PrimitiveID], g_uint_value[2]) != 1u) return;\n  if (atomicMin(g_uint_fs.data[gl_PrimitiveID], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_fs.data[gl_PrimitiveID], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_fs.data[gl_PrimitiveID], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_fs.data[gl_PrimitiveID], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_fs.data[gl_PrimitiveID], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_fs.data[gl_PrimitiveID], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_fs.data[gl_PrimitiveID] = 1u;\n    return;\n  }\n\n  if (atomicExchange(g_int_fs.data[gl_PrimitiveID], 1) != 0) return;\n  if (atomicAdd(g_int_fs.data[gl_PrimitiveID], 2) != 1) return;\n  if (atomicMin(g_int_fs.data[gl_PrimitiveID], 1) != 3) return;\n  if (atomicMax(g_int_fs.data[gl_PrimitiveID], 2) != 1) return;\n  if (atomicAnd(g_int_fs.data[gl_PrimitiveID], 0x1) != 2) return;\n  if (atomicOr(g_int_fs.data[gl_PrimitiveID], 0x3) != 0) return;\n  if (atomicXor(g_int_fs.data[gl_PrimitiveID], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_fs.data[gl_PrimitiveID], 0x2, 0x7) != 2) {\n    g_int_fs.data[gl_PrimitiveID] = 1;\n    return;\n  }\n}"
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,
                 "\nlayout(location = 0) in vec4 g_in_position;\nlayout(std430, binding = 0) coherent buffer VSuint {\n  uint g_uint_out[4];\n};\nlayout(std430, binding = 1) coherent buffer VSint {\n  int data[4];\n} g_int_out;\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  gl_Position = g_in_position;\n\n  if (atomicExchange(g_uint_out[gl_VertexID], g_uint_value[1]) != 0u) return;\n  if (atomicAdd(g_uint_out[gl_VertexID], g_uint_value[2]) != 1u) return;\n  if (atomicMin(g_uint_out[gl_VertexID], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_out[gl_VertexID], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_out[gl_VertexID], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_out[gl_VertexID], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_out[gl_VertexID], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_out[gl_VertexID], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_out[gl_VertexID] = 1u;\n    return;\n  }\n\n  if (atomicExchange(g_int_out.data[gl_VertexID], 1) != 0) return;\n  if (atomicAdd(g_int_out.data[gl_VertexID], 2) != 1) return;\n  if (atomicMin(g_int_out.data[gl_VertexID], 1) != 3) return;\n  if (atomicMax(g_int_out.data[gl_VertexID], 2) != 1) return;\n  if (atomicAnd(g_int_out.data[gl_VertexID], 0x1) != 2) return;\n  if (atomicOr(g_int_out.data[gl_VertexID], 0x3) != 0) return;\n  if (atomicXor(g_int_out.data[gl_VertexID], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_out.data[gl_VertexID], 0x2, 0x7) != 2) {\n    g_int_out.data[gl_VertexID] = 1;\n    return;\n  }\n}"
                 ,&local_51);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,
                 "\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout(std430, binding = 2) coherent buffer GSuint {\n  uint data[4];\n} g_uint_gs;\nlayout(std430, binding = 3) coherent buffer GSint {\n  int data[4];\n} g_int_gs;\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  gl_Position = gl_in[0].gl_Position;\n  gl_PrimitiveID = gl_PrimitiveIDIn;\n  EmitVertex();\n\n  if (atomicExchange(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[1]) != 0u) return;\n  if (atomicAdd(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[2]) != 1u) return;\n  if (atomicMin(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_gs.data[gl_PrimitiveIDIn], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_gs.data[gl_PrimitiveIDIn] = 1u;\n    return;\n  }\n\n  if (atomicExchange(g_int_gs.data[gl_PrimitiveIDIn], 1) != 0) return;\n  if (atomicAdd(g_int_gs.data[gl_PrimitiveIDIn], 2) != 1) return;\n  if (atomicMin(g_int_gs.data[gl_PrimitiveIDIn], 1) != 3) return;\n  if (atomicMax(g_int_gs.data[gl_PrimitiveIDIn], 2) != 1) return;\n  if (atomicAnd(g_int_gs.data[gl_PrimitiveIDIn], 0x1) != 2) return;\n  if (atomicOr(g_int_gs.data[gl_PrimitiveIDIn], 0x3) != 0) return;\n  if (atomicXor(g_int_gs.data[gl_PrimitiveIDIn], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_gs.data[gl_PrimitiveIDIn], 0x2, 0x7) != 2) {\n    g_int_gs.data[gl_PrimitiveIDIn] = 1;\n    return;\n  }\n}"
                 ,&local_d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i,
                 "\nlayout(location = 0) out vec4 g_fs_out;\nlayout(std430, binding = 4) coherent buffer FSuint {\n  uint data[4];\n} g_uint_fs;\nlayout(std430, binding = 5) coherent buffer FSint {\n  int data[4];\n} g_int_fs;\nuniform uint g_uint_value[8] = uint[8](3u, 1u, 2u, 0x1u, 0x3u, 0x1u, 0x2u, 0x7u);\nvoid main() {\n  g_fs_out = vec4(0, 1, 0, 1);\n\n  if (atomicExchange(g_uint_fs.data[gl_PrimitiveID], g_uint_value[1]) != 0u) return;\n  if (atomicAdd(g_uint_fs.data[gl_PrimitiveID], g_uint_value[2]) != 1u) return;\n  if (atomicMin(g_uint_fs.data[gl_PrimitiveID], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_fs.data[gl_PrimitiveID], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_fs.data[gl_PrimitiveID], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_fs.data[gl_PrimitiveID], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_fs.data[gl_PrimitiveID], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_fs.data[gl_PrimitiveID], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_fs.data[gl_PrimitiveID] = 1u;\n    return;\n  }\n\n  if (atomicExchange(g_int_fs.data[gl_PrimitiveID], 1) != 0) return;\n  if (atomicAdd(g_int_fs.data[gl_PrimitiveID], 2) != 1) return;\n  if (atomicMin(g_int_fs.data[gl_PrimitiveID], 1) != 3) return;\n  if (atomicMax(g_int_fs.data[gl_PrimitiveID], 2) != 1) return;\n  if (atomicAnd(g_int_fs.data[gl_PrimitiveID], 0x1) != 2) return;\n  if (atomicOr(g_int_fs.data[gl_PrimitiveID], 0x3) != 0) return;\n  if (atomicXor(g_int_fs.data[gl_PrimitiveID], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_fs.data[gl_PrimitiveID], 0x2, 0x7) != 2) {\n    g_int_fs.data[gl_PrimitiveID] = 1;\n    return;\n  }\n}"
                 ,(allocator<char> *)((long)data + 0xf));
      GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                        ((ShaderStorageBufferObjectBase *)this,&local_50,&local_88,&local_b0,
                         &local_d8,(string *)&i);
      *(GLuint *)&(this->super_ComputeShaderBase).renderTarget = GVar2;
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)((long)data + 0xf));
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_51);
      glu::CallLogWrapper::glLinkProgram
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
      bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                        ((ShaderStorageBufferObjectBase *)this,
                         *(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
      if (bVar1) {
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,6,
                   (GLuint *)((long)&(this->super_ComputeShaderBase).renderTarget + 4));
        for (data[2] = 0; (uint)data[2] < 6; data[2] = data[2] + 1) {
          memset(data_1 + 6,0,0x10);
          glu::CallLogWrapper::glBindBufferBase
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90d2,data[2],
                     (GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data
                             [(ulong)(uint)data[2] - 3]);
          glu::CallLogWrapper::glBufferData
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90d2,0x10,data_1 + 6,0x88e8);
        }
        uStack_138 = 0xbf4ccccdbf4ccccd;
        data_1[0] = 0.8;
        data_1[1] = -0.8;
        data_1[2] = -0.8;
        data_1[3] = 0.8;
        data_1[4] = 0.8;
        data_1[5] = 0.8;
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_program);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,this->m_program);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0x20,&stack0xfffffffffffffec8,0x88e4);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0);
        glu::CallLogWrapper::glGenVertexArrays
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,
                   (GLuint *)((this->super_ComputeShaderBase).g_color_eps.m_data + 3));
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,
                   (GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data[3]);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,this->m_program);
        glu::CallLogWrapper::glVertexAttribPointer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,2,0x1406,'\0',0,(void *)0x0);
        glu::CallLogWrapper::glBindBuffer
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0);
        glu::CallLogWrapper::glClear
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x4000);
        glu::CallLogWrapper::glUseProgram
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,*(GLuint *)&(this->super_ComputeShaderBase).renderTarget);
        glu::CallLogWrapper::glBindVertexArray
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,
                   (GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data[3]);
        glu::CallLogWrapper::glDrawArrays
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,0,4);
        glu::CallLogWrapper::glMemoryBarrier
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x200);
        for (local_13c = 0; local_13c < 3; local_13c = local_13c + 1) {
          glu::CallLogWrapper::glBindBuffer
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90d2,
                     (GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data
                             [(long)(local_13c << 1) + -3]);
          glu::CallLogWrapper::glGetBufferSubData
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90d2,0,0x10,&local_158);
          for (local_15c = 0; local_15c < 4; local_15c = local_15c + 1) {
            if ((&local_158)[local_15c] != 7) {
              anon_unknown_0::Output
                        ("uData at index %d is %d should be %d.\n",(ulong)local_15c,
                         (ulong)(&local_158)[local_15c],7);
              return (long)&DAT_ffffffffffffffff;
            }
          }
          glu::CallLogWrapper::glBindBuffer
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90d2,
                     (GLuint)(this->super_ComputeShaderBase).g_color_eps.m_data
                             [(long)(local_13c * 2 + 1) + -3]);
          glu::CallLogWrapper::glGetBufferSubData
                    (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x90d2,0,0x10,&local_178);
          for (local_17c = 0; (int)local_17c < 4; local_17c = local_17c + 1) {
            if ((&local_178)[(int)local_17c] != 7) {
              anon_unknown_0::Output
                        ("iData at index %d is %d should be %d.\n",(ulong)local_17c,
                         (ulong)(&local_178)[(int)local_17c],7);
              return (long)&DAT_ffffffffffffffff;
            }
          }
        }
        this_local = (BasicAtomicCase1_conflict *)0x0;
      }
      else {
        this_local = (BasicAtomicCase1_conflict *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicAtomicCase1_conflict *)0x10;
    }
  }
  else {
    this_local = (BasicAtomicCase1_conflict *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 8) in;" NL "layout(std430, binding = 0) buffer Output {" NL
			   "  uint g_add_output[8];" NL "  int g_sub_output[8];" NL "};" NL "shared uint g_add_value;" NL
			   "shared int g_sub_value;" NL "void main() {" NL "  if (gl_LocalInvocationIndex == 0) {" NL
			   "    g_add_value = 0u;" NL "    g_sub_value = 7;" NL "  }" NL
			   "  g_add_output[gl_LocalInvocationIndex] = 0u;" NL "  g_sub_output[gl_LocalInvocationIndex] = 0;" NL
			   "  groupMemoryBarrier();" NL "  barrier();" NL
			   "  g_add_output[gl_LocalInvocationIndex] = atomicAdd(g_add_value, 1u);" NL
			   "  g_sub_output[gl_LocalInvocationIndex] = atomicAdd(g_sub_value, -1);" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 16 * sizeof(int), NULL, GL_STATIC_DRAW);

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		std::vector<int> data(8);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int) * 8, &data[0]);
		std::sort(data.begin(), data.end());
		for (int i = 0; i < 8; ++i)
		{
			if (data[i] != i)
			{
				Output("Data at index %d is %d should be %d.\n", i, data[i], i);
				return ERROR;
			}
		}

		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, sizeof(int) * 8, sizeof(int) * 8, &data[0]);
		std::sort(data.begin(), data.end());
		for (int i = 0; i < 8; ++i)
		{
			if (data[i] != i)
			{
				Output("Data at index %d is %d should be %d.\n", i, data[i], i);
				return ERROR;
			}
		}

		return NO_ERROR;
	}